

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_8::DiskHandle::datasync(DiskHandle *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_28;
  Fault f;
  SyscallResult local_14;
  DiskHandle *pDStack_10;
  SyscallResult _kjSyscallResult;
  DiskHandle *this_local;
  
  f.exception = (Exception *)this;
  pDStack_10 = this;
  local_14 = _::Debug::syscall<kj::(anonymous_namespace)::DiskHandle::datasync()const::_lambda()_1_>
                       ((anon_class_8_1_8991fb9c *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_14);
  _::Debug::Fault::Fault
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x144,osErrorNumber,"fdatasync(fd)","");
  _::Debug::Fault::fatal(&local_28);
}

Assistant:

void datasync() const {
    // The presence of the _POSIX_SYNCHRONIZED_IO define is supposed to tell us that fdatasync()
    // exists. But Apple defines this yet doesn't offer fdatasync(). Thanks, Apple.
#if _POSIX_SYNCHRONIZED_IO && !__APPLE__
    KJ_SYSCALL(fdatasync(fd));
#else
    this->sync();
#endif
  }